

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::
     vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  *pSrc;
  
  if (num != 0) {
    lVar1 = 0;
    do {
      *(undefined8 *)((long)pDst_void + lVar1) = *(undefined8 *)((long)pSrc_void + lVar1);
      lVar1 = lVar1 + 8;
    } while ((ulong)num << 3 != lVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }